

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGParseNameClass
          (xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node,xmlRelaxNGDefinePtr_conflict def)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  xmlChar *local_68;
  xmlRelaxNGDefinePtr_conflict local_50;
  xmlRelaxNGDefinePtr_conflict last;
  xmlNodePtr child;
  xmlChar *val;
  xmlRelaxNGDefinePtr_conflict tmp;
  xmlRelaxNGDefinePtr_conflict ret;
  xmlRelaxNGDefinePtr_conflict def_local;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  tmp = def;
  if (((((((node != (xmlNodePtr)0x0) && (node->ns != (xmlNs *)0x0)) &&
         (node->type == XML_ELEMENT_NODE)) &&
        ((iVar1 = xmlStrEqual(node->name,"name"), iVar1 != 0 &&
         (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 != 0)))) ||
       ((((node != (xmlNodePtr)0x0 &&
          ((node->ns != (xmlNs *)0x0 && (node->type == XML_ELEMENT_NODE)))) &&
         (iVar1 = xmlStrEqual(node->name,(xmlChar *)"anyName"), iVar1 != 0)) &&
        (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 != 0)))) ||
      ((((node != (xmlNodePtr)0x0 && (node->ns != (xmlNs *)0x0)) && (node->type == XML_ELEMENT_NODE)
        ) && ((iVar1 = xmlStrEqual(node->name,(xmlChar *)"nsName"), iVar1 != 0 &&
              (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 != 0)))))) &&
     ((def->type != XML_RELAXNG_ELEMENT && (def->type != XML_RELAXNG_ATTRIBUTE)))) {
    tmp = xmlRelaxNGNewDefine(ctxt,node);
    if (tmp == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    tmp->parent = def;
    if ((ctxt->flags & 1U) == 0) {
      tmp->type = XML_RELAXNG_ELEMENT;
    }
    else {
      tmp->type = XML_RELAXNG_ATTRIBUTE;
    }
  }
  if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
     ((node->type != XML_ELEMENT_NODE ||
      ((iVar1 = xmlStrEqual(node->name,"name"), iVar1 == 0 ||
       (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 == 0)))))) {
    if (((node == (xmlNodePtr)0x0) ||
        (((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)) ||
         (iVar1 = xmlStrEqual(node->name,(xmlChar *)"anyName"), iVar1 == 0)))) ||
       (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 == 0)) {
      if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
         ((node->type != XML_ELEMENT_NODE ||
          ((iVar1 = xmlStrEqual(node->name,(xmlChar *)"nsName"), iVar1 == 0 ||
           (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 == 0)))))) {
        if (((node == (xmlNodePtr)0x0) ||
            (((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)) ||
             (iVar1 = xmlStrEqual(node->name,(xmlChar *)"choice"), iVar1 == 0)))) ||
           (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 == 0)) {
          if (node == (xmlNodePtr)0x0) {
            local_68 = "nothing";
          }
          else {
            local_68 = node->name;
          }
          xmlRngPErr(ctxt,node,0x3ee,"expecting name, anyName, nsName or choice : got %s\n",local_68
                     ,(xmlChar *)0x0);
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        local_50 = (xmlRelaxNGDefinePtr_conflict)0x0;
        tmp = def;
        if (def->type != XML_RELAXNG_CHOICE) {
          tmp = xmlRelaxNGNewDefine(ctxt,node);
          if (tmp == (xmlRelaxNGDefinePtr_conflict)0x0) {
            return (xmlRelaxNGDefinePtr_conflict)0x0;
          }
          tmp->parent = def;
          tmp->type = XML_RELAXNG_CHOICE;
        }
        if (node->children == (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,node,0x3ef,"Element choice is empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
        }
        else {
          for (last = (xmlRelaxNGDefinePtr_conflict)node->children;
              last != (xmlRelaxNGDefinePtr_conflict)0x0; last = last->content) {
            pxVar4 = xmlRelaxNGParseNameClass(ctxt,(xmlNodePtr)last,tmp);
            pxVar3 = local_50;
            if (((pxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
                (pxVar3 = pxVar4, local_50 != (xmlRelaxNGDefinePtr_conflict)0x0)) &&
               (pxVar3 = local_50, pxVar4 != tmp)) {
              local_50->next = pxVar4;
              pxVar3 = pxVar4;
            }
            local_50 = pxVar3;
          }
        }
      }
      else {
        tmp->name = (xmlChar *)0x0;
        pxVar2 = xmlGetProp(node,"ns");
        tmp->ns = pxVar2;
        if (tmp->ns == (xmlChar *)0x0) {
          xmlRngPErr(ctxt,node,0x421,"nsName has no ns attribute\n",(xmlChar *)0x0,(xmlChar *)0x0);
        }
        if ((((ctxt->flags & 1U) != 0) && (tmp->ns != (xmlChar *)0x0)) &&
           (iVar1 = xmlStrEqual(tmp->ns,(xmlChar *)"http://www.w3.org/2000/xmlns"), iVar1 != 0)) {
          xmlRngPErr(ctxt,node,0x462,"Attribute with namespace \'%s\' is not allowed\n",tmp->ns,
                     (xmlChar *)0x0);
        }
        if (node->children != (_xmlNode *)0x0) {
          pxVar3 = xmlRelaxNGParseExceptNameClass
                             (ctxt,node->children,(uint)(def->type == XML_RELAXNG_ATTRIBUTE));
          tmp->nameClass = pxVar3;
        }
      }
    }
    else {
      tmp->name = (xmlChar *)0x0;
      tmp->ns = (xmlChar *)0x0;
      if (node->children != (_xmlNode *)0x0) {
        pxVar3 = xmlRelaxNGParseExceptNameClass
                           (ctxt,node->children,(uint)(def->type == XML_RELAXNG_ATTRIBUTE));
        tmp->nameClass = pxVar3;
      }
    }
  }
  else {
    pxVar2 = xmlNodeGetContent(node);
    xmlRelaxNGNormExtSpace(pxVar2);
    iVar1 = xmlValidateNCName(pxVar2,0);
    if (iVar1 != 0) {
      if (node->parent == (_xmlNode *)0x0) {
        xmlRngPErr(ctxt,node,0x3fb,"name \'%s\' is not an NCName\n",pxVar2,(xmlChar *)0x0);
      }
      else {
        xmlRngPErr(ctxt,node,0x3fb,"Element %s name \'%s\' is not an NCName\n",node->parent->name,
                   pxVar2);
      }
    }
    tmp->name = pxVar2;
    pxVar2 = xmlGetProp(node,"ns");
    tmp->ns = pxVar2;
    if ((((ctxt->flags & 1U) != 0) && (pxVar2 != (xmlChar *)0x0)) &&
       (iVar1 = xmlStrEqual(pxVar2,(xmlChar *)"http://www.w3.org/2000/xmlns"), iVar1 != 0)) {
      xmlRngPErr(ctxt,node,0x462,"Attribute with namespace \'%s\' is not allowed\n",pxVar2,
                 (xmlChar *)0x0);
    }
    if ((((ctxt->flags & 1U) != 0) && (pxVar2 != (xmlChar *)0x0)) &&
       ((*pxVar2 == '\0' && (iVar1 = xmlStrEqual(tmp->name,"xmlns"), iVar1 != 0)))) {
      xmlRngPErr(ctxt,node,0x461,"Attribute with QName \'xmlns\' is not allowed\n",pxVar2,
                 (xmlChar *)0x0);
    }
  }
  if (tmp != def) {
    if (def->nameClass == (xmlRelaxNGDefinePtr)0x0) {
      def->nameClass = tmp;
    }
    else {
      for (val = (xmlChar *)def->nameClass; *(long *)(val + 0x40) != 0;
          val = *(xmlChar **)(val + 0x40)) {
      }
      *(xmlRelaxNGDefinePtr_conflict *)(val + 0x40) = tmp;
    }
  }
  return tmp;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParseNameClass(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node,
                         xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr ret, tmp;
    xmlChar *val;

    ret = def;
    if ((IS_RELAXNG(node, "name")) || (IS_RELAXNG(node, "anyName")) ||
        (IS_RELAXNG(node, "nsName"))) {
        if ((def->type != XML_RELAXNG_ELEMENT) &&
            (def->type != XML_RELAXNG_ATTRIBUTE)) {
            ret = xmlRelaxNGNewDefine(ctxt, node);
            if (ret == NULL)
                return (NULL);
            ret->parent = def;
            if (ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE)
                ret->type = XML_RELAXNG_ATTRIBUTE;
            else
                ret->type = XML_RELAXNG_ELEMENT;
        }
    }
    if (IS_RELAXNG(node, "name")) {
        val = xmlNodeGetContent(node);
        xmlRelaxNGNormExtSpace(val);
        if (xmlValidateNCName(val, 0)) {
	    if (node->parent != NULL)
		xmlRngPErr(ctxt, node, XML_RNGP_ELEMENT_NAME,
			   "Element %s name '%s' is not an NCName\n",
			   node->parent->name, val);
	    else
		xmlRngPErr(ctxt, node, XML_RNGP_ELEMENT_NAME,
			   "name '%s' is not an NCName\n",
			   val, NULL);
        }
        ret->name = val;
        val = xmlGetProp(node, BAD_CAST "ns");
        ret->ns = val;
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (val != NULL) &&
            (xmlStrEqual(val, BAD_CAST "http://www.w3.org/2000/xmlns"))) {
	    xmlRngPErr(ctxt, node, XML_RNGP_XML_NS,
                        "Attribute with namespace '%s' is not allowed\n",
                        val, NULL);
        }
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (val != NULL) &&
            (val[0] == 0) && (xmlStrEqual(ret->name, BAD_CAST "xmlns"))) {
	    xmlRngPErr(ctxt, node, XML_RNGP_XMLNS_NAME,
                       "Attribute with QName 'xmlns' is not allowed\n",
                       val, NULL);
        }
    } else if (IS_RELAXNG(node, "anyName")) {
        ret->name = NULL;
        ret->ns = NULL;
        if (node->children != NULL) {
            ret->nameClass =
                xmlRelaxNGParseExceptNameClass(ctxt, node->children,
                                               (def->type ==
                                                XML_RELAXNG_ATTRIBUTE));
        }
    } else if (IS_RELAXNG(node, "nsName")) {
        ret->name = NULL;
        ret->ns = xmlGetProp(node, BAD_CAST "ns");
        if (ret->ns == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_NSNAME_NO_NS,
                       "nsName has no ns attribute\n", NULL, NULL);
        }
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (ret->ns != NULL) &&
            (xmlStrEqual
             (ret->ns, BAD_CAST "http://www.w3.org/2000/xmlns"))) {
            xmlRngPErr(ctxt, node, XML_RNGP_XML_NS,
                       "Attribute with namespace '%s' is not allowed\n",
                       ret->ns, NULL);
        }
        if (node->children != NULL) {
            ret->nameClass =
                xmlRelaxNGParseExceptNameClass(ctxt, node->children,
                                               (def->type ==
                                                XML_RELAXNG_ATTRIBUTE));
        }
    } else if (IS_RELAXNG(node, "choice")) {
        xmlNodePtr child;
        xmlRelaxNGDefinePtr last = NULL;

        if (def->type == XML_RELAXNG_CHOICE) {
            ret = def;
        } else {
            ret = xmlRelaxNGNewDefine(ctxt, node);
            if (ret == NULL)
                return (NULL);
            ret->parent = def;
            ret->type = XML_RELAXNG_CHOICE;
        }

        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_CHOICE_EMPTY,
                       "Element choice is empty\n", NULL, NULL);
        } else {

            child = node->children;
            while (child != NULL) {
                tmp = xmlRelaxNGParseNameClass(ctxt, child, ret);
                if (tmp != NULL) {
                    if (last == NULL) {
                        last = tmp;
                    } else if (tmp != ret) {
                        last->next = tmp;
                        last = tmp;
                    }
                }
                child = child->next;
            }
        }
    } else {
        xmlRngPErr(ctxt, node, XML_RNGP_CHOICE_CONTENT,
                   "expecting name, anyName, nsName or choice : got %s\n",
                   (node == NULL ? (const xmlChar *) "nothing" : node->name),
		   NULL);
        return (NULL);
    }
    if (ret != def) {
        if (def->nameClass == NULL) {
            def->nameClass = ret;
        } else {
            tmp = def->nameClass;
            while (tmp->next != NULL) {
                tmp = tmp->next;
            }
            tmp->next = ret;
        }
    }
    return (ret);
}